

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

void TPZFMatrix<long>::PrintStatic
               (long *ptr,int64_t rows,int64_t cols,char *name,ostream *out,MatrixOutputFormat form)

{
  ostream *poVar1;
  void *pvVar2;
  char *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  ostream *in_R8;
  int in_R9D;
  long val_1;
  int64_t col_2;
  int64_t row_2;
  char number [32];
  long val;
  int64_t col_1;
  int64_t row_1;
  int64_t col;
  int64_t row;
  long local_88;
  long local_80;
  char local_78 [32];
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  ostream *local_28;
  char *local_20;
  long local_18;
  long local_10;
  long local_8;
  
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (in_R9D == 0) {
    local_20 = in_RCX;
    std::operator<<(in_R8,"Writing matrix \'");
    if (local_20 != (char *)0x0) {
      std::operator<<(local_28,local_20);
    }
    poVar1 = std::operator<<(local_28,"\' (");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
    poVar1 = std::operator<<(poVar1," x ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
    std::operator<<(poVar1,"):\n");
    for (local_38 = 0; local_38 < local_10; local_38 = local_38 + 1) {
      std::operator<<(local_28,"\t");
      for (local_40 = 0; local_40 < local_18; local_40 = local_40 + 1) {
        poVar1 = (ostream *)
                 std::ostream::operator<<
                           (local_28,*(long *)(local_8 + (local_40 * local_10 + local_38) * 8));
        std::operator<<(poVar1,"  ");
      }
      std::operator<<(local_28,"\n");
    }
    std::operator<<(local_28,"\n");
  }
  else if (in_R9D == 1) {
    poVar1 = (ostream *)std::ostream::operator<<(in_R8,in_RSI);
    poVar1 = std::operator<<(poVar1," ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,local_18);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    for (local_48 = 0; local_48 < local_10; local_48 = local_48 + 1) {
      for (local_50 = 0; local_50 < local_18; local_50 = local_50 + 1) {
        local_58 = *(long *)(local_8 + (local_50 * local_10 + local_48) * 8);
        if (local_58 != 0) {
          poVar1 = (ostream *)std::ostream::operator<<(local_28,local_48);
          poVar1 = std::operator<<(poVar1,' ');
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_50);
          poVar1 = std::operator<<(poVar1,' ');
          pvVar2 = (void *)std::ostream::operator<<(poVar1,local_58);
          std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
        }
      }
    }
    std::operator<<(local_28,"-1 -1 0.\n");
  }
  else if (in_R9D == 2) {
    poVar1 = std::operator<<(in_R8,in_RCX);
    std::operator<<(poVar1,"\n{ ");
    for (local_80 = 0; local_80 < local_10; local_80 = local_80 + 1) {
      std::operator<<(local_28,"\n{ ");
      for (local_88 = 0; local_88 < local_18; local_88 = local_88 + 1) {
        std::fabs<long>(*(long *)(local_8 + (local_88 * local_10 + local_80) * 8));
        sprintf(local_78,"%16.16lf");
        std::operator<<(local_28,local_78);
        if (local_88 < local_18 + -1) {
          std::operator<<(local_28,", ");
        }
        if ((local_88 + 1) % 6 == 0) {
          std::ostream::operator<<(local_28,std::endl<char,std::char_traits<char>>);
        }
      }
      std::operator<<(local_28," }");
      if (local_80 < local_10 + -1) {
        std::operator<<(local_28,",");
      }
    }
    std::operator<<(local_28," }\n");
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::PrintStatic(const TVar *ptr, int64_t rows, int64_t cols, const char *name, std::ostream& out,const MatrixOutputFormat form){
    
    if(form == EFormatted) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << rows << " x " << cols << "):\n";
        
        for ( int64_t row = 0; row < rows; row++) {
            out << "\t";
            for ( int64_t col = 0; col < cols; col++ ) {
                out << SELECTEL(ptr,rows, row, col) << "  ";
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EInputFormat) {
        out << rows << " " << cols << endl;
        for ( int64_t row = 0; row < rows; row++) {
            for ( int64_t col = 0; col < cols; col++ ) {
                TVar val = SELECTEL(ptr,rows,row, col);
                if(val != (TVar)0.) out << row << ' ' << col << ' ' << val << std::endl;
            }
        }
        out << "-1 -1 0.\n";
    } else if( form == EMathematicaInput)
    {
        char number[32];
        out << name << "\n{ ";
        for ( int64_t row = 0; row < rows; row++) {
            out << "\n{ ";
            for ( int64_t col = 0; col < cols; col++ ) {
                TVar val = SELECTEL(ptr,rows,row, col);
                sprintf(number, "%16.16lf", (double)fabs(val));
                out << number;
                if(col < cols-1)
                    out << ", ";
                if((col+1) % 6 == 0)out << std::endl;
            }
            out << " }";
            if(row < rows-1)
                out << ",";
        }
        
        out << " }\n";
        
    }
    
}